

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void duckdb::TemplatedWritePlain<short,int,duckdb::ParquetCastOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  data_ptr_t pdVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  idx_t r;
  NumericStatisticsState<short,_int,_duckdb::BaseParquetOperator> *numeric_stats;
  int local_write [2048];
  int local_2038 [2050];
  
  pdVar1 = col->data;
  lVar4 = 0;
  for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&mask->super_TemplatedValidityMask<unsigned_long>,chunk_start);
    if (bVar2) {
      iVar3 = (int)*(short *)(pdVar1 + chunk_start * 2);
      if (iVar3 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
        *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar3;
      }
      if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar3) {
        *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar3;
      }
      local_2038[lVar4] = iVar3;
      lVar4 = lVar4 + 1;
      if (lVar4 == 0x800) {
        (**ser->_vptr_WriteStream)(ser,local_2038,0x2000);
        lVar4 = 0;
      }
    }
  }
  (**ser->_vptr_WriteStream)(ser,local_2038,lVar4 << 2);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}